

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O3

mapped_type * __thiscall
eastl::
hash_map<eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_false>
::operator[](hash_map<eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_false>
             *this,key_type *key)

{
  byte bVar1;
  value_type *__src;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  undefined1 *__dest;
  size_t __n;
  node_type *b;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined *local_58;
  node_type *local_48 [3];
  
  pbVar4 = (byte *)key->mpBegin;
  bVar1 = *pbVar4;
  if (bVar1 == 0) {
    uVar3 = 0x811c9dc5;
  }
  else {
    uVar3 = 0x811c9dc5;
    do {
      pbVar4 = pbVar4 + 1;
      uVar3 = uVar3 * 0x1000193 ^ (uint)bVar1;
      bVar1 = *pbVar4;
    } while (bVar1 != 0);
  }
  b = (this->
      super_hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
      ).mpBucketArray
      [(ulong)uVar3 %
       (ulong)(this->
              super_hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
              ).mnBucketCount];
  if (b != (node_type *)0x0) {
    do {
      bVar2 = equal_to<eastl::basic_string<char,_eastl::allocator>_>::operator()
                        ((equal_to<eastl::basic_string<char,_eastl::allocator>_> *)
                         &(this->
                          super_hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
                          ).
                          super_hash_code_base<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_false>
                          .field_0x1,key,(basic_string<char,_eastl::allocator> *)b);
      if (bVar2) {
        if (b != (this->
                 super_hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
                 ).mpBucketArray
                 [(this->
                  super_hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
                  ).mnBucketCount]) goto LAB_001025e5;
        break;
      }
      b = b->mpNext;
    } while (b != (hash_node<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
                   *)0x0);
  }
  __src = key->mpBegin;
  __n = (long)key->mpEnd - (long)__src;
  uVar3 = (int)__n + 1;
  local_78 = &DAT_001060c5;
  __dest = &gEmptyString;
  if (1 < uVar3) {
    __dest = (undefined1 *)malloc((ulong)uVar3);
    local_78 = __dest + uVar3;
  }
  local_88 = __dest;
  memmove(__dest,__src,__n);
  local_80 = __dest + __n;
  __dest[__n] = 0;
  local_68 = &gEmptyString;
  local_58 = &DAT_001060c5;
  local_60 = &gEmptyString;
  gEmptyString = 0;
  hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
  ::DoInsertValue(local_48,&this->
                            super_hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
                  ,&local_88);
  if ((local_68 != (undefined1 *)0x0) && (1 < (long)local_58 - (long)local_68)) {
    operator_delete__(local_68);
  }
  b = local_48[0];
  if ((local_88 != (undefined1 *)0x0) && (1 < (long)local_78 - (long)local_88)) {
    operator_delete__(local_88);
  }
LAB_001025e5:
  return &(b->mValue).second;
}

Assistant:

mapped_type& operator[](const key_type& key)
        {
            const typename base_type::iterator it = base_type::find(key);
            if(it != base_type::end())
                return (*it).second;
            return (*base_type::insert(value_type(key, mapped_type())).first).second;
        }